

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

CTypeID ffi_checkctype(lua_State *L,CTState *cts,TValue *param)

{
  ulong uVar1;
  int errcode;
  CPState cp;
  CPState CStack_88;
  
  if (L->top <= L->base) {
LAB_001331b6:
    lj_err_argtype(L,1,"C type");
  }
  uVar1 = L->base->u64;
  if ((long)uVar1 >> 0x2f == -0xb) {
    if (param < L->top && param != (TValue *)0x0) {
      lj_err_arg(L,1,LJ_ERR_FFI_NUMPARAM);
    }
    CStack_88.val.id = (CTypeID)*(ushort *)((uVar1 & 0x7fffffffffff) + 10);
    if (CStack_88.val.id == 0x16) {
      CStack_88.val.id = *(uint *)((uVar1 & 0x7fffffffffff) + 0x10);
    }
  }
  else {
    if ((long)uVar1 >> 0x2f != -5) goto LAB_001331b6;
    CStack_88.p = (char *)((uVar1 & 0x7fffffffffff) + 0x18);
    CStack_88.mode = 0x12;
    CStack_88.L = L;
    CStack_88.cts = cts;
    CStack_88.param = param;
    CStack_88.srcname = CStack_88.p;
    errcode = lj_cparse(&CStack_88);
    if (errcode != 0) {
      lj_err_throw(L,errcode);
    }
  }
  return CStack_88.val.id;
}

Assistant:

static CTypeID ffi_checkctype(lua_State *L, CTState *cts, TValue *param)
{
  TValue *o = L->base;
  if (!(o < L->top)) {
  err_argtype:
    lj_err_argtype(L, 1, "C type");
  }
  if (tvisstr(o)) {  /* Parse an abstract C type declaration. */
    GCstr *s = strV(o);
    CPState cp;
    int errcode;
    cp.L = L;
    cp.cts = cts;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = param;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    errcode = lj_cparse(&cp);
    if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
    return cp.val.id;
  } else {
    GCcdata *cd;
    if (!tviscdata(o)) goto err_argtype;
    if (param && param < L->top) lj_err_arg(L, 1, LJ_ERR_FFI_NUMPARAM);
    cd = cdataV(o);
    return cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) : cd->ctypeid;
  }
}